

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void scroll_callback(GLFWwindow *window,double xoffset,double yoffset)

{
  float fVar1;
  
  printf("scroll called [%F %F]\n");
  if ((1.0 <= fov) && (fov <= 45.0)) {
    fov = (float)((double)fov - yoffset);
  }
  fVar1 = 1.0;
  if ((fov <= 1.0) || (fVar1 = 45.0, 45.0 <= fov)) {
    fov = fVar1;
  }
  return;
}

Assistant:

void scroll_callback(GLFWwindow* window, double xoffset, double yoffset)
{
    //not working on linux
  printf ("scroll called [%F %F]\n",xoffset,yoffset);
  if (fov >= 1.0f && fov <= 45.0f)
    fov -= yoffset;
  if (fov <= 1.0f)
    fov = 1.0f;
  if (fov >= 45.0f)
    fov = 45.0f;
}